

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::RuntimeError::~RuntimeError(RuntimeError *this)

{
  Error::~Error((Error *)this);
  operator_delete(this);
  return;
}

Assistant:

explicit RuntimeError(int exit_code = 1) : RuntimeError("Runtime error", exit_code) {}